

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [22],int *params_1,
          char (*params_2) [3],char **params_3,char (*params_4) [9],String *params_5,
          String *params_6,char *params_7)

{
  long lVar1;
  char *pcVar2;
  FixedArray<char,_1UL> *params_7_00;
  undefined1 local_a9 [9];
  char *local_a0;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  CappedArray<char,_14UL> local_58;
  ArrayPtr<const_char> local_40;
  
  local_68 = toCharSequence<char_const(&)[22]>((char (*) [22])this);
  toCharSequence<int&>(&local_58,(kj *)params,(int *)local_68.size_);
  local_78 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  local_88 = toCharSequence<char*>((char **)params_2);
  params_7_00 = (FixedArray<char,_1UL> *)0x24689f;
  local_98 = toCharSequence<char_const(&)[9]>((char (*) [9])params_3);
  lVar1 = *(long *)(*params_4 + 8);
  local_a9._1_8_ = lVar1;
  if (lVar1 != 0) {
    local_a9._1_8_ = *(undefined8 *)*params_4;
  }
  local_a0 = (char *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_a0 = (char *)0x0;
  }
  pcVar2 = (char *)(params_5->content).size_;
  local_40.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_40.ptr = (params_5->content).ptr;
  }
  local_40.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_40.size_ = (size_t)(char *)0x0;
  }
  local_a9[0] = *(undefined1 *)&(params_6->content).ptr;
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_68,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_14UL> *)&local_78,&local_88,&local_98,
             (ArrayPtr<const_char> *)(local_a9 + 1),&local_40,(ArrayPtr<const_char> *)local_a9,
             params_7_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}